

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::MoveAddChar
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  pointer pBVar5;
  reference pvVar6;
  int local_44;
  char C;
  int X;
  int Y;
  const_iterator Iterator;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  Iterator._M_node = (_List_node_base *)Args;
  sVar4 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(Args);
  if (sVar4 == 3) {
    _X = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::cbegin
                   (Iterator._M_node);
    pBVar5 = std::_List_const_iterator<cvm::BasicValue>::operator->
                       ((_List_const_iterator<cvm::BasicValue> *)&X);
    iVar2 = BasicValue::toInt(pBVar5);
    std::_List_const_iterator<cvm::BasicValue>::operator++
              ((_List_const_iterator<cvm::BasicValue> *)&X);
    pBVar5 = std::_List_const_iterator<cvm::BasicValue>::operator->
                       ((_List_const_iterator<cvm::BasicValue> *)&X);
    iVar3 = BasicValue::toInt(pBVar5);
    pvVar6 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::back
                       ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Iterator._M_node)
    ;
    iVar1 = (pvVar6->field_2).IntVal;
    iVar2 = wmove(_stdscr,iVar2,iVar3);
    if (iVar2 == -1) {
      local_44 = -1;
    }
    else {
      local_44 = waddch(_stdscr,(int)(char)iVar1);
    }
    BasicValue::BasicValue(__return_storage_ptr__,local_44);
  }
  else {
    BasicValue::BasicValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::MoveAddChar(std::list<BasicValue> &Args) {
  if (Args.size() != 3)
    return BasicValue();

  auto Iterator = Args.cbegin();

  int Y = Iterator->toInt();
  ++Iterator;
  int X = Iterator->toInt();

  char C = static_cast<char>(Args.back().IntVal);
  return mvaddch(Y, X, C);
}